

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filename.cpp
# Opt level: O0

string * __thiscall embree::FileName::name_abi_cxx11_(FileName *this)

{
  long lVar1;
  ulong uVar2;
  ulong in_RSI;
  string *in_RDI;
  size_t end;
  size_t start;
  undefined8 local_18;
  
  lVar1 = std::__cxx11::string::find_last_of((char)in_RSI,0x2f);
  if (lVar1 == -1) {
    local_18 = 0;
  }
  else {
    local_18 = lVar1 + 1;
  }
  uVar2 = std::__cxx11::string::find_last_of((char)in_RSI,0x2e);
  if ((uVar2 == 0xffffffffffffffff) || (uVar2 < local_18)) {
    std::__cxx11::string::size();
  }
  std::__cxx11::string::substr((ulong)in_RDI,in_RSI);
  return in_RDI;
}

Assistant:

std::string FileName::name() const {
    size_t start = filename.find_last_of(path_sep);
    if (start == std::string::npos) start = 0; else start++;
    size_t end = filename.find_last_of('.');
    if (end == std::string::npos || end < start) end = filename.size();
    return filename.substr(start, end - start);
  }